

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExFreakOperator.cpp
# Opt level: O0

void __thiscall lts2::ExFreakOperator::Apply(ExFreakOperator *this,Mat *X,Mat *Ax)

{
  _InputArray *p_Var1;
  float fVar2;
  double dVar3;
  double dVar4;
  double mes_neg;
  double mes_pos;
  float *pfStack_d8;
  int i;
  float *p_ax;
  _InputArray local_b8;
  Scalar_<double> local_a0;
  _InputArray local_80;
  Scalar_<double> local_58;
  _InputArray local_38;
  _InputArray *local_20;
  Mat *Ax_local;
  Mat *X_local;
  ExFreakOperator *this_local;
  
  local_20 = (_InputArray *)Ax;
  Ax_local = X;
  X_local = (Mat *)this;
  cv::Mat::create((int)Ax,*(int *)&(this->super_LBDOperator).super_LinearOperator.field_0xc,1);
  p_Var1 = local_20;
  cv::Scalar_<double>::Scalar_(&local_58,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_38,(Matx<double,_4,_1> *)&local_58);
  cv::noArray();
  cv::Mat::setTo(p_Var1,&local_38);
  cv::_InputArray::~_InputArray(&local_38);
  if (*(long *)&(this->super_LBDOperator).field_0x28 != 0) {
    cv::Scalar_<double>::Scalar_(&local_a0,0.0);
    cv::_InputArray::_InputArray<double,4,1>(&local_80,(Matx<double,_4,_1> *)&local_a0);
    cv::noArray();
    cv::Mat::setTo((_InputArray *)&(this->super_LBDOperator)._integralImage,&local_80);
    cv::_InputArray::~_InputArray(&local_80);
  }
  cv::_InputArray::_InputArray(&local_b8,Ax_local);
  cv::_OutputArray::_OutputArray((_OutputArray *)&p_ax,&(this->super_LBDOperator)._integralImage);
  cv::integral(&local_b8,(_OutputArray *)&p_ax,6);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&p_ax);
  cv::_InputArray::~_InputArray(&local_b8);
  pfStack_d8 = cv::Mat::ptr<float>((Mat *)local_20,0);
  for (mes_pos._4_4_ = 0;
      mes_pos._4_4_ < *(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc;
      mes_pos._4_4_ = mes_pos._4_4_ + 1) {
    dVar3 = LBDOperator::measureAtCell
                      (&this->super_LBDOperator,
                       (this->super_LBDOperator)._basisFunctions[(int)mes_pos._4_4_].pos_cell);
    dVar4 = LBDOperator::measureAtCell
                      (&this->super_LBDOperator,
                       (this->super_LBDOperator)._basisFunctions[(int)mes_pos._4_4_].neg_cell);
    fVar2 = cv::saturate_cast<float>(dVar3 - dVar4);
    *pfStack_d8 = fVar2;
    pfStack_d8 = pfStack_d8 + 1;
  }
  return;
}

Assistant:

void lts2::ExFreakOperator::Apply(cv::Mat const& X, cv::Mat& Ax)
{
    // Create a column vector where rows = number_of_active_pairs
    Ax.create(_pairsInUse, 1, CV_32FC1);
    Ax.setTo(cv::Scalar(0));

    // Compute the integral image for later
    if (_integralImage.data)
        _integralImage.setTo(cv::Scalar(0));
    cv::integral(X, _integralImage, CV_64F);
    
    // Apply each pair
#ifdef WITH_DISPATCH
    dispatch_queue_t queue = dispatch_get_global_queue(DISPATCH_QUEUE_PRIORITY_HIGH, 0);
    dispatch_apply(_pairsInUse, queue,
                   ^(size_t i) {
                     double mes_pos = measureAtCell(_basisFunctions[i].pos_cell);
                     double mes_neg = measureAtCell(_basisFunctions[i].neg_cell);
                     *Ax.ptr<float>(i) = cv::saturate_cast<float>(mes_pos - mes_neg);
                   });
#else
    float* p_ax = Ax.ptr<float>(0);
    for (int i = 0; i < _pairsInUse; ++i)
    {
        double mes_pos = measureAtCell(_basisFunctions[i].pos_cell);
        double mes_neg = measureAtCell(_basisFunctions[i].neg_cell);
        
        *p_ax++ = cv::saturate_cast<float>(mes_pos - mes_neg);
    }
#endif
}